

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O3

size_t __thiscall embree::SceneGraph::PlyParser::loadInteger(PlyParser *this,Tag ty)

{
  char cVar1;
  byte bVar2;
  short sVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  runtime_error *this_00;
  
  switch(ty) {
  case PTY_CHAR:
    cVar1 = read_char(this);
    sVar7 = (size_t)cVar1;
    break;
  case PTY_UCHAR:
    bVar2 = read_uchar(this);
    sVar7 = (size_t)bVar2;
    break;
  case PTY_SHORT:
    sVar3 = read_short(this);
    sVar7 = (size_t)sVar3;
    break;
  case PTY_USHORT:
    uVar4 = read_ushort(this);
    sVar7 = (size_t)uVar4;
    break;
  case PTY_INT:
    iVar5 = read_int(this);
    sVar7 = (size_t)iVar5;
    break;
  case PTY_UINT:
    uVar6 = read_uint(this);
    sVar7 = (size_t)uVar6;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return sVar7;
}

Assistant:

size_t loadInteger(Type::Tag ty)
      {
        switch (ty) {
        case Type::PTY_CHAR   : return read_char(); break;
        case Type::PTY_UCHAR  : return read_uchar(); break;
        case Type::PTY_SHORT  : return read_short(); break;
        case Type::PTY_USHORT : return read_ushort(); break;
        case Type::PTY_INT    : return read_int(); break;
        case Type::PTY_UINT   : return read_uint(); break;
        default : throw std::runtime_error("invalid type"); return 0;
        }
      }